

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey.c
# Opt level: O1

void ssort1(string *x,int n,int depth)

{
  byte bVar1;
  byte bVar2;
  string puVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  uint n_00;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  string t;
  string *ppuVar17;
  long lVar18;
  uint uVar19;
  
  uVar12 = (ulong)(uint)n;
LAB_001d6757:
  iVar11 = (int)uVar12;
  if (iVar11 < 2) {
    return;
  }
  iVar5 = rand();
  puVar3 = *x;
  *x = x[iVar5 % iVar11];
  x[iVar5 % iVar11] = puVar3;
  bVar1 = (*x)[depth];
  uVar10 = iVar11 - 1;
  iVar5 = 1;
  uVar19 = 1;
  uVar6 = uVar10;
  do {
    lVar14 = (long)(int)uVar6;
    iVar8 = iVar5;
    if (iVar5 <= (int)uVar6) {
      lVar7 = (long)iVar5 + -1;
      do {
        bVar2 = x[lVar7 + 1][depth];
        iVar8 = iVar5;
        if (bVar1 < bVar2) break;
        if (bVar2 == bVar1) {
          puVar3 = x[(int)uVar19];
          x[(int)uVar19] = x[lVar7 + 1];
          x[lVar7 + 1] = puVar3;
          uVar19 = uVar19 + 1;
        }
        iVar5 = iVar5 + 1;
        lVar7 = lVar7 + 1;
        iVar8 = uVar6 + 1;
      } while (lVar7 < lVar14);
    }
    lVar7 = (long)iVar8;
    bVar4 = (int)uVar6 < iVar8;
    if ((int)uVar6 < iVar8) break;
    puVar3 = x[lVar14];
    bVar2 = puVar3[depth];
    while (bVar1 <= bVar2) {
      uVar6 = uVar6 - 1;
      if (bVar2 == bVar1) {
        x[lVar14] = x[(int)uVar10];
        x[(int)uVar10] = puVar3;
        uVar10 = uVar10 - 1;
      }
      bVar4 = lVar14 <= lVar7;
      if (lVar14 <= lVar7) goto LAB_001d6840;
      puVar3 = x[lVar14 + -1];
      lVar14 = lVar14 + -1;
      bVar2 = puVar3[depth];
    }
    uVar6 = (uint)lVar14;
    if (bVar4) break;
    puVar3 = x[lVar7];
    x[lVar7] = x[(int)uVar6];
    x[(int)uVar6] = puVar3;
    iVar5 = iVar8 + 1;
    uVar6 = uVar6 - 1;
  } while( true );
LAB_001d6840:
  n_00 = iVar8 - uVar19;
  lVar14 = (long)(int)n_00;
  uVar9 = n_00;
  if ((int)uVar19 < (int)n_00) {
    uVar9 = uVar19;
  }
  if (0 < (int)uVar9) {
    lVar18 = (long)(int)uVar19;
    if (lVar14 <= (int)uVar19) {
      lVar18 = lVar14;
    }
    uVar15 = 0;
    do {
      puVar3 = x[uVar15];
      x[uVar15] = x[(lVar7 + uVar15) - lVar18];
      x[(lVar7 + uVar15) - lVar18] = puVar3;
      uVar15 = uVar15 + 1;
    } while (uVar9 != uVar15);
  }
  uVar6 = uVar10 - uVar6;
  uVar13 = ~uVar10 + iVar11;
  uVar9 = uVar13;
  if ((int)uVar6 < (int)uVar13) {
    uVar9 = uVar6;
  }
  lVar18 = (long)(int)uVar6;
  if (0 < (int)uVar9) {
    lVar16 = (long)(int)uVar13;
    if (lVar18 <= (int)uVar13) {
      lVar16 = lVar18;
    }
    iVar5 = uVar9 + 1;
    ppuVar17 = x;
    do {
      puVar3 = ppuVar17[lVar7];
      ppuVar17[lVar7] = ppuVar17[iVar11 - lVar16];
      ppuVar17[iVar11 - lVar16] = puVar3;
      ppuVar17 = ppuVar17 + 1;
      iVar5 = iVar5 + -1;
    } while (1 < iVar5);
  }
  ssort1(x,n_00,depth);
  if (x[lVar14][depth] != '\0') {
    ssort1(x + lVar14,uVar19 + iVar11 + ~uVar10,depth + 1);
  }
  x = x + (uVar12 - lVar18);
  uVar12 = (ulong)uVar6;
  goto LAB_001d6757;
}

Assistant:

static void ssort1(string x[], int n, int depth)
{   int    a, b, c, d, r, v;
    if (n <= 1)
        return;
    a = rand() % n;
    swap(0, a);
    v = i2c(0);
    a = b = 1;
    c = d = n-1;
    for (;;) {
        while (b <= c && (r = i2c(b)-v) <= 0) {
            if (r == 0) { swap(a, b); a++; }
            b++;
        }
        while (b <= c && (r = i2c(c)-v) >= 0) {
            if (r == 0) { swap(c, d); d--; }
            c--;
        }
        if (b > c) break;
        swap(b, c);
        b++;
        c--;
    }
    r = min(a, b-a);     vecswap(0, b-r, r, x);
    r = min(d-c, n-d-1); vecswap(b, n-r, r, x);
    r = b-a; ssort1(x, r, depth);
    if (i2c(r) != 0)
        ssort1(x + r, a + n-d-1, depth+1);
    r = d-c; ssort1(x + n-r, r, depth);
}